

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::readCPPline(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  TParseContextBase *pTVar2;
  int iVar3;
  long lVar4;
  char *local_30;
  char *local_28;
  
  iVar3 = scanToken(this,ppToken);
  if ((iVar3 == -1) || (iVar3 == 10)) goto LAB_004429bd;
  if (iVar3 != 0xa2) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"invalid directive","#","");
    goto LAB_004429bd;
  }
  iVar3 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
  switch(iVar3) {
  case 0xa3:
    iVar3 = CPPdefine(this,ppToken);
    break;
  case 0xa4:
    iVar3 = CPPundef(this,ppToken);
    break;
  case 0xa5:
    iVar3 = CPPif(this,ppToken);
    break;
  case 0xa6:
    iVar3 = 1;
    goto LAB_00442815;
  case 0xa7:
    iVar3 = 0;
LAB_00442815:
    iVar3 = CPPifdef(this,iVar3,ppToken);
    break;
  case 0xa8:
    lVar4 = (long)this->elsetracker;
    if (this->elseSeen[lVar4] == true) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"#else after #else","#else","");
      lVar4 = (long)this->elsetracker;
    }
    this->elseSeen[lVar4] = true;
    if (this->ifdepth == 0) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"mismatched statements","#else","");
    }
    iVar3 = scanToken(this,ppToken);
    extraTokenCheck(this,0xa8,ppToken,iVar3);
    goto LAB_004428cf;
  case 0xa9:
    if (this->ifdepth == 0) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"mismatched statements","#elif","");
    }
    if (this->elseSeen[this->elsetracker] == true) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"#elif after #else","#elif","");
    }
    do {
      iVar3 = scanToken(this,ppToken);
      if (iVar3 == 10) break;
    } while (iVar3 != -1);
LAB_004428cf:
    iVar3 = CPPelse(this,0,ppToken);
    break;
  case 0xaa:
    iVar3 = this->ifdepth;
    if (iVar3 == 0) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"mismatched statements","#endif","");
    }
    else {
      iVar1 = this->elsetracker;
      this->elseSeen[iVar1] = false;
      this->elsetracker = iVar1 + -1;
      this->ifdepth = iVar3 + -1;
    }
    iVar3 = scanToken(this,ppToken);
    iVar3 = extraTokenCheck(this,0xaa,ppToken,iVar3);
    break;
  case 0xab:
    iVar3 = CPPline(this,ppToken);
    break;
  case 0xac:
    iVar3 = CPPpragma(this,ppToken);
    break;
  case 0xad:
    CPPerror(this,ppToken);
    iVar3 = 10;
    break;
  case 0xae:
    iVar3 = CPPversion(this,ppToken);
    break;
  default:
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"invalid directive:","#",ppToken->name);
    iVar3 = 0xa2;
    break;
  case 0xb2:
    iVar3 = CPPextension(this,ppToken);
    break;
  case 0xb6:
    pTVar2 = this->parseContext;
    if (((pTVar2->super_TParseVersions).messages & EShMsgReadHlsl) == EShMsgDefault) {
      local_30 = "GL_GOOGLE_include_directive";
      local_28 = "GL_ARB_shading_language_include";
      (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[6])
                (pTVar2,ppToken,2,&local_30,"#include");
    }
    iVar3 = CPPinclude(this,ppToken);
  }
LAB_004429bd:
  while ((iVar3 != -1 && (iVar3 != 10))) {
    iVar3 = scanToken(this,ppToken);
  }
  return iVar3;
}

Assistant:

int TPpContext::readCPPline(TPpToken* ppToken)
{
    int token = scanToken(ppToken);

    if (token == PpAtomIdentifier) {
        switch (atomStrings.getAtom(ppToken->name)) {
        case PpAtomDefine:
            token = CPPdefine(ppToken);
            break;
        case PpAtomElse:
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#else after #else", "#else", "");
            elseSeen[elsetracker] = true;
            if (ifdepth == 0)
                parseContext.ppError(ppToken->loc, "mismatched statements", "#else", "");
            token = extraTokenCheck(PpAtomElse, ppToken, scanToken(ppToken));
            token = CPPelse(0, ppToken);
            break;
        case PpAtomElif:
            if (ifdepth == 0)
                parseContext.ppError(ppToken->loc, "mismatched statements", "#elif", "");
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
            // this token is really a dont care, but we still need to eat the tokens
            token = scanToken(ppToken);
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);
            token = CPPelse(0, ppToken);
            break;
        case PpAtomEndif:
            if (ifdepth == 0)
                parseContext.ppError(ppToken->loc, "mismatched statements", "#endif", "");
            else {
                elseSeen[elsetracker] = false;
                --elsetracker;
                --ifdepth;
            }
            token = extraTokenCheck(PpAtomEndif, ppToken, scanToken(ppToken));
            break;
        case PpAtomIf:
            token = CPPif(ppToken);
            break;
        case PpAtomIfdef:
            token = CPPifdef(1, ppToken);
            break;
        case PpAtomIfndef:
            token = CPPifdef(0, ppToken);
            break;
        case PpAtomLine:
            token = CPPline(ppToken);
            break;
        case PpAtomInclude:
            if(!parseContext.isReadingHLSL()) {
                const std::array exts = { E_GL_GOOGLE_include_directive, E_GL_ARB_shading_language_include };
                parseContext.ppRequireExtensions(ppToken->loc, exts, "#include");
            }
            token = CPPinclude(ppToken);
            break;
        case PpAtomPragma:
            token = CPPpragma(ppToken);
            break;
        case PpAtomUndef:
            token = CPPundef(ppToken);
            break;
        case PpAtomError:
            token = CPPerror(ppToken);
            break;
        case PpAtomVersion:
            token = CPPversion(ppToken);
            break;
        case PpAtomExtension:
            token = CPPextension(ppToken);
            break;
        default:
            parseContext.ppError(ppToken->loc, "invalid directive:", "#", ppToken->name);
            break;
        }
    } else if (token != '\n' && token != EndOfInput)
        parseContext.ppError(ppToken->loc, "invalid directive", "#", "");

    while (token != '\n' && token != EndOfInput)
        token = scanToken(ppToken);

    return token;
}